

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O1

Slice __thiscall leveldb::BlockBuilder::Finish(BlockBuilder *this)

{
  long lVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Slice SVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar2) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    do {
      PutFixed32(&this->buffer_,puVar2[uVar4]);
      uVar4 = uVar4 + 1;
      puVar2 = (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->restarts_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
    } while (uVar4 < uVar3);
  }
  PutFixed32(&this->buffer_,(uint32_t)uVar3);
  this->finished_ = true;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  SVar5.data_ = (this->buffer_)._M_dataplus._M_p;
  SVar5.size_ = (this->buffer_)._M_string_length;
  return SVar5;
}

Assistant:

Slice BlockBuilder::Finish() {
  // Append restart array
  for (size_t i = 0; i < restarts_.size(); i++) {
    PutFixed32(&buffer_, restarts_[i]);
  }
  PutFixed32(&buffer_, restarts_.size());
  finished_ = true;
  return Slice(buffer_);
}